

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O0

void __thiscall CGV::visit(CGV *this,CompareOp *node)

{
  CodeWriter *pCVar1;
  bool bVar2;
  ASTNode *this_00;
  string *psVar3;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  allocator local_4c9;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  allocator local_451;
  string local_450;
  allocator local_429;
  string local_428;
  allocator local_401;
  string local_400;
  allocator local_3d9;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  allocator local_389;
  string local_388;
  allocator local_361;
  string local_360;
  allocator local_339;
  string local_338;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  undefined1 local_110 [8];
  string compareNodeSymbol;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  ASTNode *local_18;
  CompareOp *node_local;
  CGV *this_local;
  
  local_18 = &node->super_ASTNode;
  node_local = (CompareOp *)this;
  visitNodesAndUpdateFramePointer(this,&node->super_ASTNode,false);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"r1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"r12",&local_71);
  CodeWriter::loadWord(pCVar1,&local_38,-4,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"r2",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"r12",&local_c1);
  CodeWriter::loadWord(pCVar1,&local_98,-0xc,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"Comparing",
             (allocator *)(compareNodeSymbol.field_2._M_local_buf + 0xf));
  CodeWriter::comment(pCVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(compareNodeSymbol.field_2._M_local_buf + 0xf));
  this_00 = AST::ASTNode::getChild(local_18,1);
  psVar3 = AST::ASTNode::getName_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)local_110,(string *)psVar3);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_110,"==");
  if (bVar2) {
    pCVar1 = this->writer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"ceq",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"r1",&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"r1",&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"r2",&local_1a9);
    CodeWriter::OP(pCVar1,&local_130,&local_158,&local_180,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110,"<>");
    if (bVar2) {
      pCVar1 = this->writer;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d0,"cne",&local_1d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,"r1",&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_220,"r1",&local_221);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_248,"r2",&local_249);
      CodeWriter::OP(pCVar1,&local_1d0,&local_1f8,&local_220,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110,"<=");
      if (bVar2) {
        pCVar1 = this->writer;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_270,"cle",&local_271);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_298,"r1",&local_299);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2c0,"r1",&local_2c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2e8,"r2",&local_2e9);
        CodeWriter::OP(pCVar1,&local_270,&local_298,&local_2c0,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator((allocator<char> *)&local_299);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator((allocator<char> *)&local_271);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_110,">=");
        if (bVar2) {
          pCVar1 = this->writer;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_310,"cge",&local_311);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_338,"r1",&local_339);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_360,"r1",&local_361);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_388,"r2",&local_389);
          CodeWriter::OP(pCVar1,&local_310,&local_338,&local_360,&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          std::allocator<char>::~allocator((allocator<char> *)&local_389);
          std::__cxx11::string::~string((string *)&local_360);
          std::allocator<char>::~allocator((allocator<char> *)&local_361);
          std::__cxx11::string::~string((string *)&local_338);
          std::allocator<char>::~allocator((allocator<char> *)&local_339);
          std::__cxx11::string::~string((string *)&local_310);
          std::allocator<char>::~allocator((allocator<char> *)&local_311);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_110,">");
          if (bVar2) {
            pCVar1 = this->writer;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3b0,"cgt",&local_3b1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3d8,"r1",&local_3d9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_400,"r1",&local_401);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_428,"r2",&local_429);
            CodeWriter::OP(pCVar1,&local_3b0,&local_3d8,&local_400,&local_428);
            std::__cxx11::string::~string((string *)&local_428);
            std::allocator<char>::~allocator((allocator<char> *)&local_429);
            std::__cxx11::string::~string((string *)&local_400);
            std::allocator<char>::~allocator((allocator<char> *)&local_401);
            std::__cxx11::string::~string((string *)&local_3d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
            std::__cxx11::string::~string((string *)&local_3b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
          }
          else {
            pCVar1 = this->writer;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_450,"clt",&local_451);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_478,"r1",&local_479);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4a0,"r1",&local_4a1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4c8,"r2",&local_4c9);
            CodeWriter::OP(pCVar1,&local_450,&local_478,&local_4a0,&local_4c8);
            std::__cxx11::string::~string((string *)&local_4c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
            std::__cxx11::string::~string((string *)&local_478);
            std::allocator<char>::~allocator((allocator<char> *)&local_479);
            std::__cxx11::string::~string((string *)&local_450);
            std::allocator<char>::~allocator((allocator<char> *)&local_451);
          }
        }
      }
    }
  }
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f0,"r12",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_518,"r1",&local_519);
  CodeWriter::saveWord(pCVar1,-4,&local_4f0,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::__cxx11::string::~string((string *)local_110);
  return;
}

Assistant:

void CGV::visit(CompareOp *node) {
    visitNodesAndUpdateFramePointer(node, false);
    writer->loadWord("r1", -4, "r12");
    writer->loadWord("r2", -12, "r12");

    writer->comment("Comparing");
    auto compareNodeSymbol = node->getChild(1)->getName();
    if (compareNodeSymbol == "==") writer->OP("ceq", "r1", "r1", "r2");
    else if (compareNodeSymbol == "<>") writer->OP("cne", "r1", "r1", "r2");
    else if (compareNodeSymbol == "<=") writer->OP("cle", "r1", "r1", "r2");
    else if (compareNodeSymbol == ">=") writer->OP("cge", "r1", "r1", "r2");
    else if (compareNodeSymbol == ">") writer->OP("cgt", "r1", "r1", "r2");
    else writer->OP("clt", "r1", "r1", "r2");
    writer->saveWord(-4, "r12", "r1");
}